

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

Watcher * __thiscall
efsw::FileWatcherInotify::watcherContainsDirectory(FileWatcherInotify *this,string *dir)

{
  __type _Var1;
  _Base_ptr p_Var2;
  Watcher *pWVar3;
  Lock lock;
  string watcherPath;
  Lock local_68;
  string local_60;
  string local_40;
  
  FileSystem::dirRemoveSlashAtEnd(dir);
  std::__cxx11::string::string((string *)&local_40,(string *)dir);
  FileSystem::pathRemoveFileName(&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  FileSystem::dirAddSlashAtEnd(&local_60);
  local_68.mMutex = &this->mWatchesLock;
  Mutex::lock(local_68.mMutex);
  for (p_Var2 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    pWVar3 = (Watcher *)p_Var2[1]._M_parent;
    _Var1 = std::operator==(&pWVar3->Directory,&local_60);
    if (_Var1) goto LAB_0010bda0;
  }
  pWVar3 = (Watcher *)0x0;
LAB_0010bda0:
  Lock::~Lock(&local_68);
  std::__cxx11::string::~string((string *)&local_60);
  return pWVar3;
}

Assistant:

Watcher* FileWatcherInotify::watcherContainsDirectory( std::string dir ) {
	FileSystem::dirRemoveSlashAtEnd( dir );
	std::string watcherPath = FileSystem::pathRemoveFileName( dir );
	FileSystem::dirAddSlashAtEnd( watcherPath );
	Lock lock( mWatchesLock );

	for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); ++it ) {
		Watcher* watcher = it->second;
		if ( watcher->Directory == watcherPath )
			return watcher;
	}

	return NULL;
}